

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O2

void __thiscall
tcu::FloatFormat::FloatFormat
          (FloatFormat *this,int minExp,int maxExp,int fractionBits,bool exactPrecision,
          YesNoMaybe hasSubnormal_,YesNoMaybe hasInf_,YesNoMaybe hasNaN_)

{
  double dVar1;
  double dVar2;
  
  this->m_minExp = minExp;
  this->m_maxExp = maxExp;
  this->m_fractionBits = fractionBits;
  this->m_hasSubnormal = hasSubnormal_;
  this->m_hasInf = hasInf_;
  this->m_hasNaN = hasNaN_;
  this->m_exactPrecision = exactPrecision;
  dVar1 = ldexp(1.0,maxExp);
  dVar2 = ldexp((double)~(-1L << ((byte)fractionBits & 0x3f)),maxExp - fractionBits);
  this->m_maxValue = dVar2 + dVar1;
  return;
}

Assistant:

FloatFormat::FloatFormat (int			minExp,
						  int			maxExp,
						  int			fractionBits,
						  bool			exactPrecision,
						  YesNoMaybe	hasSubnormal_,
						  YesNoMaybe	hasInf_,
						  YesNoMaybe	hasNaN_)
	: m_minExp			(minExp)
	, m_maxExp			(maxExp)
	, m_fractionBits	(fractionBits)
	, m_hasSubnormal	(hasSubnormal_)
	, m_hasInf			(hasInf_)
	, m_hasNaN			(hasNaN_)
	, m_exactPrecision	(exactPrecision)
	, m_maxValue		(computeMaxValue(maxExp, fractionBits))
{
	DE_ASSERT(minExp <= maxExp);
}